

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfFrameBuffer.cpp
# Opt level: O3

Slice * __thiscall Imf_3_4::FrameBuffer::operator[](FrameBuffer *this,char *name)

{
  const_iterator cVar1;
  ostream *poVar2;
  ArgExc *this_00;
  stringstream _iex_throw_s;
  key_type local_1a0;
  
  strncpy(local_1a0._text,name,0xff);
  local_1a0._text[0xff] = '\0';
  cVar1 = std::
          _Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
          ::find((_Rb_tree<Imf_3_4::Name,_std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>,_std::_Select1st<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>,_std::less<Imf_3_4::Name>,_std::allocator<std::pair<const_Imf_3_4::Name,_Imf_3_4::Slice>_>_>
                  *)this,&local_1a0);
  if ((_Rb_tree_header *)cVar1._M_node != &(this->_map)._M_t._M_impl.super__Rb_tree_header) {
    return (Slice *)(cVar1._M_node + 9);
  }
  iex_debugTrap();
  std::__cxx11::stringstream::stringstream((stringstream *)&local_1a0);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)(local_1a0._text + 0x10),"Cannot find frame buffer slice \"",0x20);
  poVar2 = std::operator<<((ostream *)(local_1a0._text + 0x10),name);
  std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\".",2);
  this_00 = (ArgExc *)__cxa_allocate_exception(0x48);
  Iex_3_4::ArgExc::ArgExc(this_00,(stringstream *)&local_1a0);
  __cxa_throw(this_00,&Iex_3_4::ArgExc::typeinfo,Iex_3_4::ArgExc::~ArgExc);
}

Assistant:

const Slice&
FrameBuffer::operator[] (const char name[]) const
{
    SliceMap::const_iterator i = _map.find (name);

    if (i == _map.end ())
    {
        THROW (
            IEX_NAMESPACE::ArgExc,
            "Cannot find frame buffer slice \"" << name << "\".");
    }

    return i->second;
}